

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,double *value)

{
  Message *a_message;
  Message *in_stack_ffffffffffffffd0;
  Message local_20;
  double *local_18;
  double *value_local;
  AssertionResult *this_local;
  
  local_18 = value;
  value_local = (double *)this;
  Message::Message(in_stack_ffffffffffffffd0);
  a_message = Message::operator<<(&local_20,local_18);
  AppendMessage(this,a_message);
  Message::~Message((Message *)0x158b40);
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }